

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_implicit_all(lyd_node **tree,ly_ctx *ctx,uint32_t implicit_options,lyd_node **diff)

{
  lyd_node *plVar1;
  lysc_node *plVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  ly_ctx *ctx_00;
  char *pcVar5;
  lyd_node **diff_00;
  uint32_t i;
  lyd_node *d;
  uint32_t local_44;
  lyd_node *local_40;
  uint32_t local_34;
  
  local_40 = (lyd_node *)0x0;
  local_44 = 0;
  local_34 = implicit_options;
  if (tree == (lyd_node **)0x0) {
    pcVar5 = "tree";
  }
  else {
    plVar1 = *tree;
    if (ctx != (ly_ctx *)0x0 || plVar1 != (lyd_node *)0x0) {
      if (plVar1 != (lyd_node *)0x0) {
        if (plVar1->schema == (lysc_node *)0x0) {
          ctx_00 = (ly_ctx *)plVar1[2].schema;
          if ((ctx_00 == ctx || ctx_00 == (ly_ctx *)0x0) || ctx == (ly_ctx *)0x0) goto LAB_0012f93f;
        }
        else {
          ctx_00 = plVar1->schema->module->ctx;
          if ((ctx_00 == ctx || ctx_00 == (ly_ctx *)0x0) || ctx == (ly_ctx *)0x0) goto LAB_0012f93f;
        }
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
LAB_0012f93f:
      if (diff != (lyd_node **)0x0) {
        *diff = (lyd_node *)0x0;
      }
      if (ctx == (ly_ctx *)0x0) {
        plVar2 = (*tree)->schema;
        if (plVar2 == (lysc_node *)0x0) {
          plVar4 = (lys_module *)&(*tree)[2].schema;
        }
        else {
          plVar4 = plVar2->module;
        }
        ctx = plVar4->ctx;
      }
      plVar4 = ly_ctx_get_module_iter(ctx,&local_44);
      if (plVar4 != (lys_module *)0x0) {
        diff_00 = &local_40;
        if (diff == (lyd_node **)0x0) {
          diff_00 = (lyd_node **)0x0;
        }
        do {
          if (plVar4->implemented != '\0') {
            LVar3 = lyd_new_implicit_module(tree,plVar4,local_34,diff_00);
            if (LVar3 != LY_SUCCESS) {
              if (diff == (lyd_node **)0x0) {
                return LVar3;
              }
              lyd_free_all(*diff);
              *diff = (lyd_node *)0x0;
              return LVar3;
            }
            if (local_40 != (lyd_node *)0x0) {
              lyd_insert_sibling(*diff,local_40,diff);
              local_40 = (lyd_node *)0x0;
            }
          }
          plVar4 = ly_ctx_get_module_iter(ctx,&local_44);
        } while (plVar4 != (lys_module *)0x0);
      }
      return LY_SUCCESS;
    }
    pcVar5 = "*tree || ctx";
    ctx = (ly_ctx *)0x0;
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_new_implicit_all");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_all(struct lyd_node **tree, const struct ly_ctx *ctx, uint32_t implicit_options, struct lyd_node **diff)
{
    const struct lys_module *mod;
    struct lyd_node *d = NULL;
    uint32_t i = 0;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(ctx, tree, *tree || ctx, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }
    if (!ctx) {
        ctx = LYD_CTX(*tree);
    }

    /* add nodes for each module one-by-one */
    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        if (!mod->implemented) {
            continue;
        }

        LY_CHECK_GOTO(rc = lyd_new_implicit_module(tree, mod, implicit_options, diff ? &d : NULL), cleanup);
        if (d) {
            /* merge into one diff */
            lyd_insert_sibling(*diff, d, diff);

            d = NULL;
        }
    }

cleanup:
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}